

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

NodePtr __thiscall avro::makeNode(avro *this,Entity *e,SymbolTable *st,string *ns)

{
  EntityType EVar1;
  NodePtr *pNVar2;
  bool bVar3;
  int iVar4;
  String *pSVar5;
  Array *pAVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *p_Var7;
  string *psVar8;
  NodeUnion *this_00;
  string *s;
  iterator iVar9;
  NodeSymbolic *this_01;
  NodeRecord *pNVar10;
  mapped_type *pmVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  undefined4 extraout_var;
  int64_t iVar14;
  NodeFixed *this_02;
  NodeEnum *this_03;
  NodeArray *this_04;
  NodeMap *this_05;
  Exception *pEVar15;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar17;
  pointer pEVar18;
  NodePtr NVar19;
  NodePtr node;
  NodePtr result;
  GenericDatum d;
  Name n;
  NodePtr result_1;
  MultiAttribute<boost::shared_ptr<avro::Node>_> mm;
  value_type local_160 [12];
  MultiAttribute<boost::shared_ptr<avro::Node>_> fieldValues;
  GenericDatum local_78;
  NodePtr local_68;
  NodePtr r;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> defaultValues;
  
  EVar1 = e->type_;
  if (EVar1 == etObject) {
    p_Var7 = &json::Entity::objectValue_abi_cxx11_(e)->_M_t;
    std::__cxx11::string::string<std::allocator<char>>((string *)&mm,"type",(allocator<char> *)&n);
    psVar8 = getStringField(e,(Object *)p_Var7,(string *)&mm);
    std::__cxx11::string::~string((string *)&mm);
    makePrimitive((avro *)&result_1,psVar8);
    sVar17 = result_1.pn;
    if (result_1.px == (element_type *)0x0) {
      bVar3 = std::operator==(psVar8,"record");
      if (!bVar3) {
        bVar3 = std::operator==(psVar8,"error");
        if (!bVar3) {
          bVar3 = std::operator==(psVar8,"enum");
          if (!bVar3) {
            bVar3 = std::operator==(psVar8,"fixed");
            if (!bVar3) {
              bVar3 = std::operator==(psVar8,"array");
              if (bVar3) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&mm,"items",(allocator<char> *)&n);
                cVar12 = findField(e,(Object *)p_Var7,(string *)&mm);
                std::__cxx11::string::~string((string *)&mm);
                this_04 = (NodeArray *)operator_new(0x28);
                makeNode((avro *)&n,(Entity *)(cVar12._M_node + 2),st,ns);
                asSingleAttribute<boost::shared_ptr<avro::Node>>
                          ((avro *)&mm,(shared_ptr<avro::Node> *)&n);
                NodeArray::NodeArray(this_04,(SingleLeaf *)&mm);
                boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeArray>
                          ((shared_ptr<avro::Node> *)this,this_04);
              }
              else {
                bVar3 = std::operator==(psVar8,"map");
                if (!bVar3) {
                  boost::detail::shared_count::~shared_count(&result_1.pn);
                  pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
                  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_format((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &mm,"Unknown type definition: %1%");
                  json::Entity::toString_abi_cxx11_(&n.ns_,e);
                  pbVar16 = boost::io::detail::
                            feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&mm,&n.ns_);
                  Exception::Exception(pEVar15,pbVar16);
                  __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&mm,"values",(allocator<char> *)&n);
                cVar12 = findField(e,(Object *)p_Var7,(string *)&mm);
                std::__cxx11::string::~string((string *)&mm);
                this_05 = (NodeMap *)operator_new(0x30);
                makeNode((avro *)&n,(Entity *)(cVar12._M_node + 2),st,ns);
                asSingleAttribute<boost::shared_ptr<avro::Node>>
                          ((avro *)&mm,(shared_ptr<avro::Node> *)&n);
                NodeMap::NodeMap(this_05,(SingleLeaf *)&mm);
                boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeMap>
                          ((shared_ptr<avro::Node> *)this,this_05);
              }
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         &mm.attrs_.
                          super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
              boost::detail::shared_count::~shared_count((shared_count *)&n.ns_._M_string_length);
              goto LAB_001900bc;
            }
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mm,"name",(allocator<char> *)&node);
      s = getStringField(e,(Object *)p_Var7,(string *)&mm);
      std::__cxx11::string::~string((string *)&mm);
      bVar3 = isFullName(s);
      if (bVar3) {
        Name::Name(&n,s);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mm,"namespace",(allocator<char> *)&node);
        cVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                 ::find(p_Var7,(key_type *)&mm);
        std::__cxx11::string::~string((string *)&mm);
        if ((_Rb_tree_header *)cVar13._M_node != &(p_Var7->_M_impl).super__Rb_tree_header) {
          if (cVar13._M_node[2]._M_color != 4) {
            pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                       "Json field \"%1%\" is not a %2%: %3%");
            pbVar16 = boost::io::detail::
                      feed<char,std::char_traits<char>,std::allocator<char>,char_const(&)[10]>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&mm,(char (*) [10])"namespace");
            result.px = (element_type *)anon_var_dwarf_175c3;
            pbVar16 = boost::io::detail::
                      feed<char,std::char_traits<char>,std::allocator<char>,char_const*const&>
                                (pbVar16,(char **)&result);
            json::Entity::toString_abi_cxx11_((string *)&node,(Entity *)(cVar13._M_node + 2));
            pbVar16 = boost::io::detail::
                      feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                                (pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&node);
            Exception::Exception(pEVar15,pbVar16);
            __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
          }
          ns = json::Entity::stringValue_abi_cxx11_((Entity *)(cVar13._M_node + 2));
        }
        Name::Name(&n,s,ns);
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      bVar3 = std::operator==(psVar8,"record");
      if (bVar3) {
LAB_0018fb26:
        pNVar10 = (NodeRecord *)operator_new(0xd0);
        NodeRecord::NodeRecord(pNVar10);
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>
                  ((shared_ptr<avro::Node> *)&mm,pNVar10);
        boost::shared_ptr<avro::Node>::operator=
                  ((shared_ptr<avro::Node> *)this,(shared_ptr<avro::Node> *)&mm);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &mm.attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        pmVar11 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[](st,&n);
        boost::shared_ptr<avro::Node>::operator=(pmVar11,(shared_ptr<avro::Node> *)this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mm,"fields",(allocator<char> *)&node);
        pAVar6 = getArrayField(e,(Object *)p_Var7,(string *)&mm);
        std::__cxx11::string::~string((string *)&mm);
        result.px = (element_type *)0x0;
        result.pn.pi_ = (sp_counted_base *)0x0;
        fieldValues.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        defaultValues.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fieldValues.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fieldValues.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        defaultValues.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        defaultValues.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (pEVar18 = (pAVar6->
                       super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            pEVar18 !=
            (pAVar6->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
            _M_impl.super__Vector_impl_data._M_finish; pEVar18 = pEVar18 + 1) {
          p_Var7 = &json::Entity::objectValue_abi_cxx11_(pEVar18)->_M_t;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&node,"name",(allocator<char> *)&d);
          psVar8 = getStringField(pEVar18,(Object *)p_Var7,(key_type *)&node);
          std::__cxx11::string::~string((string *)&node);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&node,"type",(allocator<char> *)&d);
          cVar12 = findField(pEVar18,(Object *)p_Var7,(key_type *)&node);
          std::__cxx11::string::~string((string *)&node);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&node,"default",(allocator<char> *)&d);
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                   ::find(p_Var7,(key_type *)&node);
          std::__cxx11::string::~string((string *)&node);
          makeNode((avro *)&node,(Entity *)(cVar12._M_node + 2),st,&n.ns_);
          if ((_Rb_tree_header *)cVar13._M_node == &(p_Var7->_M_impl).super__Rb_tree_header) {
            d.type_ = AVRO_NULL;
            d.value_.content = (placeholder *)0x0;
            local_78.value_.content = (placeholder *)0x0;
            local_78.type_ = d.type_;
          }
          else {
            local_68.px = node.px;
            local_68.pn.pi_ = node.pn.pi_;
            if (node.pn.pi_ != (sp_counted_base *)0x0) {
              LOCK();
              (node.pn.pi_)->use_count_ = (node.pn.pi_)->use_count_ + 1;
              UNLOCK();
            }
            makeGenericDatum((avro *)&d,&local_68,(Entity *)(cVar13._M_node + 2),st);
            boost::detail::shared_count::~shared_count(&local_68.pn);
            local_78.type_ = d.type_;
            if (d.value_.content == (placeholder *)0x0) {
              local_78.value_.content = (placeholder *)0x0;
            }
            else {
              iVar4 = (*(d.value_.content)->_vptr_placeholder[3])();
              local_78.value_.content = (placeholder *)CONCAT44(extraout_var,iVar4);
            }
          }
          Field::Field((Field *)&mm,psVar8,&node,&local_78);
          if (local_78.value_.content != (placeholder *)0x0) {
            (*(local_78.value_.content)->_vptr_placeholder[1])();
          }
          if (d.value_.content != (placeholder *)0x0) {
            (*(d.value_.content)->_vptr_placeholder[1])();
          }
          boost::detail::shared_count::~shared_count(&node.pn);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&result,
                      (value_type *)
                      mm.attrs_.
                      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
          push_back(&fieldValues.attrs_,
                    (value_type *)
                    &mm.attrs_.
                     super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::push_back
                    (&defaultValues,local_160);
          Field::~Field((Field *)&mm);
        }
        pNVar10 = (NodeRecord *)operator_new(0xd0);
        asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)&mm,&n);
        NodeRecord::NodeRecord
                  (pNVar10,(HasName *)&mm,&fieldValues,(LeafNames *)&result,&defaultValues);
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>(&r,pNVar10);
        Name::~Name((Name *)&mm);
        std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector
                  (&defaultValues);
        std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::~vector(&fieldValues.attrs_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result);
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>((boost *)&mm,&r);
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>
                  ((boost *)&node,(shared_ptr<avro::Node> *)this);
        NodeRecord::swap((NodeRecord *)
                         mm.attrs_.
                         super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(NodeRecord *)node.px);
        boost::detail::shared_count::~shared_count(&node.pn);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &mm.attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        boost::detail::shared_count::~shared_count(&r.pn);
      }
      else {
        bVar3 = std::operator==(psVar8,"error");
        if (bVar3) goto LAB_0018fb26;
        bVar3 = std::operator==(psVar8,"enum");
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&mm,"symbols",(allocator<char> *)&node);
          pAVar6 = getArrayField(e,(Object *)p_Var7,(string *)&mm);
          std::__cxx11::string::~string((string *)&mm);
          result.px = (element_type *)0x0;
          result.pn.pi_ = (sp_counted_base *)0x0;
          for (pEVar18 = (pAVar6->
                         super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              pEVar18 !=
              (pAVar6->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
              _M_impl.super__Vector_impl_data._M_finish; pEVar18 = pEVar18 + 1) {
            if (pEVar18->type_ != etString) {
              pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
              boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                        ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                         "Enum symbol not a string: %1%");
              json::Entity::toString_abi_cxx11_((string *)&node,pEVar18);
              pbVar16 = boost::io::detail::
                        feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&mm,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&node);
              Exception::Exception(pEVar15,pbVar16);
              __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
            }
            pSVar5 = json::Entity::stringValue_abi_cxx11_(pEVar18);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result,pSVar5);
          }
          this_03 = (NodeEnum *)operator_new(0xa8);
          asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)&mm,&n);
          NodeEnum::NodeEnum(this_03,(HasName *)&mm,(LeafNames *)&result);
          boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeEnum>
                    ((shared_ptr<avro::Node> *)&fieldValues,this_03);
          Name::~Name((Name *)&mm);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&mm,"size",(allocator<char> *)&node);
          iVar14 = getLongField(e,(Object *)p_Var7,(string *)&mm);
          std::__cxx11::string::~string((string *)&mm);
          if ((int)iVar14 < 1) {
            pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                       "Size for fixed is not positive: ");
            json::Entity::toString_abi_cxx11_((string *)&node,e);
            pbVar16 = boost::io::detail::
                      feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&mm,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&node);
            Exception::Exception(pEVar15,pbVar16);
            __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
          }
          this_02 = (NodeFixed *)operator_new(0x60);
          asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)&mm,&n);
          node.px = (element_type *)CONCAT44(node.px._4_4_,(int)iVar14);
          NodeFixed::NodeFixed(this_02,(HasName *)&mm,(HasSize *)&node);
          boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeFixed>
                    ((shared_ptr<avro::Node> *)&fieldValues,this_02);
          Name::~Name((Name *)&mm);
        }
        boost::shared_ptr<avro::Node>::operator=
                  ((shared_ptr<avro::Node> *)this,(shared_ptr<avro::Node> *)&fieldValues);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &fieldValues.attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        pmVar11 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[](st,&n);
        boost::shared_ptr<avro::Node>::operator=(pmVar11,(shared_ptr<avro::Node> *)this);
      }
      Name::~Name(&n);
    }
    else {
      *(element_type **)this = result_1.px;
      result_1.pn.pi_ = (sp_counted_base *)0x0;
      *(sp_counted_base **)(this + 8) = sVar17.pi_;
      result_1.px = (element_type *)0x0;
    }
LAB_001900bc:
    pNVar2 = &result_1;
  }
  else {
    if (EVar1 == etArray) {
      pAVar6 = json::Entity::arrayValue(e);
      mm.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mm.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mm.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (pEVar18 = (pAVar6->
                     super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          pEVar18 !=
          (pAVar6->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
          _M_impl.super__Vector_impl_data._M_finish; pEVar18 = pEVar18 + 1) {
        makeNode((avro *)&n,pEVar18,st,ns);
        std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::push_back(&mm.attrs_,(value_type *)&n);
        boost::detail::shared_count::~shared_count((shared_count *)&n.ns_._M_string_length);
      }
      this_00 = (NodeUnion *)operator_new(0x30);
      NodeUnion::NodeUnion(this_00,&mm);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeUnion>
                ((shared_ptr<avro::Node> *)this,this_00);
      std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
      ~vector(&mm.attrs_);
      sVar17.pi_ = extraout_RDX;
      goto LAB_001900c9;
    }
    if (EVar1 != etString) {
      pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                 "Invalid Avro type: %1%");
      json::Entity::toString_abi_cxx11_(&n.ns_,e);
      pbVar16 = boost::io::detail::
                feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                          ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                           &n.ns_);
      Exception::Exception(pEVar15,pbVar16);
      __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
    }
    pSVar5 = json::Entity::stringValue_abi_cxx11_(e);
    makePrimitive((avro *)&result,pSVar5);
    sVar17 = result.pn;
    if (result.px == (element_type *)0x0) {
      bVar3 = isFullName(pSVar5);
      if (bVar3) {
        Name::Name(&n,pSVar5);
      }
      else {
        Name::Name(&n,pSVar5,ns);
      }
      iVar9 = std::
              _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
              ::find(&st->_M_t,&n);
      if ((_Rb_tree_header *)iVar9._M_node == &(st->_M_t)._M_impl.super__Rb_tree_header) {
        pEVar15 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)&mm,
                   "Unknown type: %1%");
        Name::fullname_abi_cxx11_((string *)&node,&n);
        pbVar16 = boost::io::detail::
                  feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mm,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&node);
        Exception::Exception(pEVar15,pbVar16);
        __cxa_throw(pEVar15,&Exception::typeinfo,Exception::~Exception);
      }
      this_01 = (NodeSymbolic *)operator_new(0x68);
      asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)&mm,&n);
      node.px = *(element_type **)(iVar9._M_node + 3);
      node.pn.pi_ = (sp_counted_base *)iVar9._M_node[3]._M_parent;
      if ((_Base_ptr)node.pn.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)node.pn.pi_)->_M_parent =
             *(int *)&((_Base_ptr)node.pn.pi_)->_M_parent + 1;
        UNLOCK();
      }
      NodeSymbolic::NodeSymbolic(this_01,(HasName *)&mm,&node);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>
                ((shared_ptr<avro::Node> *)this,this_01);
      boost::detail::shared_count::~shared_count(&node.pn);
      Name::~Name((Name *)&mm);
      Name::~Name(&n);
    }
    else {
      *(element_type **)this = result.px;
      result.pn.pi_ = (sp_counted_base *)0x0;
      *(sp_counted_base **)(this + 8) = sVar17.pi_;
      result.px = (element_type *)0x0;
    }
    pNVar2 = &result;
  }
  boost::detail::shared_count::~shared_count(&pNVar2->pn);
  sVar17.pi_ = extraout_RDX_00;
LAB_001900c9:
  NVar19.pn.pi_ = sVar17.pi_;
  NVar19.px = (element_type *)this;
  return NVar19;
}

Assistant:

static NodePtr makeNode(const json::Entity& e, SymbolTable& st, const string& ns)
{
    switch (e.type()) {
    case json::etString:
        return makeNode(e.stringValue(), st, ns);
    case json::etObject:
        return makeNode(e, e.objectValue(), st, ns);
    case json::etArray:
        return makeNode(e, e.arrayValue(), st, ns);
    default:
        throw Exception(boost::format("Invalid Avro type: %1%") % e.toString());
    }
}